

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void push_val(VARR_char *repr,mir_long val)

{
  htab_size_t *phVar1;
  size_t sVar2;
  VARR_htab_ind_t *pVVar3;
  VARR_HTAB_EL_reg_var_t *pVVar4;
  void *pvVar5;
  init_object_t *piVar6;
  long lVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  MIR_reg_t MVar12;
  undefined4 uVar13;
  htab_hash_t hVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  htab_ind_t *phVar19;
  HTAB_EL_reg_var_t *pHVar20;
  VARR_init_object_t *pVVar21;
  int iVar22;
  char *in_RCX;
  uint *puVar23;
  MIR_reg_t extraout_EDX;
  htab_size_t hVar24;
  uint uVar25;
  size_t __size;
  uint *puVar26;
  uint uVar27;
  c2m_ctx_t pcVar28;
  c2m_ctx_t htab;
  c2m_ctx_t c2m_ctx;
  reg_var_t *in_R8;
  uint uVar29;
  uint uVar30;
  long lVar31;
  MIR_reg_t *pMVar32;
  reg_var_t rVar33;
  reg_var_t rVar34;
  reg_var_t rVar35;
  reg_var_t rVar36;
  reg_var_t rVar37;
  reg_var_t el;
  
  lVar31 = 10;
  if (9 < val) {
    do {
      lVar31 = lVar31 * 10;
    } while (lVar31 <= val);
  }
  while( true ) {
    iVar22 = (int)in_RCX;
    pcVar28 = (c2m_ctx_t)0x6666666666666667;
    lVar7 = lVar31 / 10;
    lVar16 = val / lVar7;
    val = val % lVar7;
    htab = (c2m_ctx_t)repr->varr;
    if (htab == (c2m_ctx_t)0x0) break;
    uVar17 = repr->els_num + 1;
    if (repr->size < uVar17) {
      __size = (uVar17 >> 1) + uVar17;
      pcVar18 = (char *)realloc(htab,__size);
      repr->varr = pcVar18;
      repr->size = __size;
    }
    sVar2 = repr->els_num;
    in_RCX = repr->varr;
    repr->els_num = sVar2 + 1;
    in_RCX[sVar2] = (char)lVar16 + '0';
    uVar17 = lVar31 - 10;
    lVar31 = lVar7;
    if (uVar17 < 10) {
      return;
    }
  }
  push_val_cold_1();
  pVVar3 = (VARR_htab_ind_t *)htab->env[0].__jmpbuf[5];
  if (pVVar3 == (VARR_htab_ind_t *)0x0) {
    HTAB_reg_var_t_do_cold_8();
    c2m_ctx = htab;
LAB_001ad512:
    HTAB_reg_var_t_do_cold_7();
LAB_001ad517:
    HTAB_reg_var_t_do_cold_2();
LAB_001ad51c:
    HTAB_reg_var_t_do_cold_1();
LAB_001ad521:
    HTAB_reg_var_t_do_cold_4();
LAB_001ad526:
    HTAB_reg_var_t_do_cold_6();
  }
  else {
    pVVar4 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
    c2m_ctx = htab;
    if (pVVar4 == (VARR_HTAB_EL_reg_var_t *)0x0) goto LAB_001ad512;
    uVar27 = (uint)pVVar3->els_num;
    pvVar5 = (void *)htab->env[0].__jmpbuf[0];
    uVar29 = uVar27;
    if ((iVar22 != 1) ||
       (hVar24 = (htab_size_t)pVVar4->els_num, *(htab_size_t *)&htab->options != hVar24)) {
LAB_001ad3be:
      rVar34.reg = extraout_EDX;
      rVar34.name = (char *)pcVar28;
      rVar34._12_4_ = 0;
      c2m_ctx = pcVar28;
      hVar14 = (*(_func_htab_hash_t_reg_var_t_void_ptr *)htab->env[0].__jmpbuf[1])(rVar34,pvVar5);
      uVar27 = hVar14 + (hVar14 == 0);
      pVVar3 = (VARR_htab_ind_t *)htab->env[0].__jmpbuf[5];
      if (pVVar3 == (VARR_htab_ind_t *)0x0) goto LAB_001ad517;
      pVVar4 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
      if (pVVar4 != (VARR_HTAB_EL_reg_var_t *)0x0) {
        phVar19 = pVVar3->varr;
        pHVar20 = pVVar4->varr;
        puVar26 = (uint *)0x0;
        uVar25 = uVar27;
        uVar30 = uVar27;
        do {
          uVar30 = uVar30 & uVar29 - 1;
          puVar23 = phVar19 + uVar30;
          uVar17 = (ulong)*puVar23;
          if (uVar17 != 0xfffffffe) {
            if (*puVar23 == 0xffffffff) {
              if (iVar22 != 1) {
                return;
              }
              *(htab_size_t *)&htab->ctx = *(htab_size_t *)&htab->ctx + 1;
              if (puVar26 != (uint *)0x0) {
                puVar23 = puVar26;
              }
              uVar29 = *(uint *)&htab->options;
              pHVar20[uVar29].hash = uVar27;
              pHVar20[uVar29].el.name = (char *)pcVar28;
              pHVar20[uVar29].el.reg = extraout_EDX;
              uVar27 = *(uint *)&htab->options;
              *(uint *)&htab->options = uVar27 + 1;
              *puVar23 = uVar27;
              in_R8->name = (char *)pcVar28;
              in_R8->reg = extraout_EDX;
              return;
            }
            puVar23 = puVar26;
            if ((pHVar20[uVar17].hash == uVar27) &&
               (uVar10 = pHVar20[uVar17].el.name, uVar11 = pHVar20[uVar17].el.reg,
               rVar35.reg = uVar11, rVar35.name = (char *)uVar10, rVar35._12_4_ = 0,
               rVar37.reg = extraout_EDX, rVar37.name = (char *)pcVar28, rVar37._12_4_ = 0,
               iVar15 = (*(_func_int_reg_var_t_reg_var_t_void_ptr *)htab->env[0].__jmpbuf[2])
                                  (rVar35,rVar37,pvVar5), iVar15 != 0)) {
              MVar12 = pHVar20[uVar17].el.reg;
              uVar13 = *(undefined4 *)&pHVar20[uVar17].el.field_0xc;
              in_R8->name = pHVar20[uVar17].el.name;
              in_R8->reg = MVar12;
              *(undefined4 *)&in_R8->field_0xc = uVar13;
              return;
            }
          }
          uVar25 = uVar25 >> 0xb;
          uVar30 = uVar25 + 1 + uVar30 * 5;
          phVar1 = (htab_size_t *)((long)&htab->options + 4);
          *phVar1 = *phVar1 + 1;
          puVar26 = puVar23;
        } while( true );
      }
      goto LAB_001ad51c;
    }
    c2m_ctx = (c2m_ctx_t)pVVar3->varr;
    if (c2m_ctx == (c2m_ctx_t)0x0) goto LAB_001ad526;
    uVar29 = uVar27 * 2;
    uVar17 = (ulong)uVar29;
    if (pVVar3->size != uVar17) {
      phVar19 = (htab_ind_t *)realloc(c2m_ctx,uVar17 * 4);
      pVVar3->varr = phVar19;
    }
    pVVar3->size = uVar17;
    pVVar3->els_num = uVar17;
    pVVar3 = (VARR_htab_ind_t *)htab->env[0].__jmpbuf[5];
    if (pVVar3 != (VARR_htab_ind_t *)0x0) {
      if (uVar29 != 0) {
        c2m_ctx = (c2m_ctx_t)pVVar3->varr;
        memset(c2m_ctx,0xff,(ulong)(uVar27 & 0x7fffffff) << 3);
      }
      pVVar4 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
      if ((pVVar4 != (VARR_HTAB_EL_reg_var_t *)0x0) &&
         (c2m_ctx = (c2m_ctx_t)pVVar4->varr, c2m_ctx != (c2m_ctx_t)0x0)) {
        uVar17 = (ulong)(hVar24 * 2);
        if (pVVar4->size != uVar17) {
          pHVar20 = (HTAB_EL_reg_var_t *)realloc(c2m_ctx,uVar17 * 0x18);
          pVVar4->varr = pHVar20;
        }
        pVVar4->size = uVar17;
        pVVar4->els_num = uVar17;
        pVVar4 = (VARR_HTAB_EL_reg_var_t *)htab->env[0].__jmpbuf[4];
        if (pVVar4 == (VARR_HTAB_EL_reg_var_t *)0x0) goto LAB_001ad530;
        pHVar20 = pVVar4->varr;
        uVar27 = *(htab_size_t *)((long)&htab->ctx + 4);
        uVar30 = *(uint *)&htab->options;
        *(htab_size_t *)&htab->ctx = 0;
        *(htab_size_t *)&htab->options = 0;
        *(htab_size_t *)((long)&htab->ctx + 4) = 0;
        if (uVar27 < uVar30) {
          pMVar32 = &pHVar20[uVar27].el.reg;
          lVar31 = (ulong)uVar30 - (ulong)uVar27;
          do {
            if (pMVar32[-4] != 0) {
              el.reg = *pMVar32;
              el.name = ((reg_var_t *)(pMVar32 + -2))->name;
              el._12_4_ = 0;
              HTAB_reg_var_t_do((HTAB_reg_var_t *)htab,el,HTAB_INSERT,in_R8);
              uVar8 = in_R8->name;
              uVar9 = in_R8->reg;
              rVar33.reg = uVar9;
              rVar33.name = (char *)uVar8;
              rVar33._12_4_ = 0;
              rVar36.reg = *pMVar32;
              rVar36.name = ((reg_var_t *)(pMVar32 + -2))->name;
              rVar36._12_4_ = 0;
              (*(_func_int_reg_var_t_reg_var_t_void_ptr *)htab->env[0].__jmpbuf[2])
                        (rVar33,rVar36,pvVar5);
            }
            pMVar32 = pMVar32 + 6;
            lVar31 = lVar31 + -1;
          } while (lVar31 != 0);
        }
        goto LAB_001ad3be;
      }
      goto LAB_001ad521;
    }
  }
  HTAB_reg_var_t_do_cold_5();
LAB_001ad530:
  HTAB_reg_var_t_do_cold_3();
  pVVar21 = c2m_ctx->init_object_path;
  if (pVVar21 != (VARR_init_object_t *)0x0) {
    uVar17 = 0xffffffffffffffff;
    lVar31 = 0x10;
    do {
      uVar17 = uVar17 + 1;
      if (pVVar21->els_num <= uVar17) {
        return;
      }
      piVar6 = pVVar21->varr;
      if (piVar6 == (init_object_t *)0x0) {
        get_object_path_offset_cold_1();
LAB_001ad622:
        __assert_fail("init_object.u.curr_member->code == N_MEMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2cab,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      lVar7 = *(long *)((long)piVar6 + lVar31 + -0x10);
      iVar22 = *(int *)(lVar7 + 0x18);
      if (iVar22 - 4U < 2) {
        if (**(int **)((long)&piVar6->container_type + lVar31) != 0x6c) goto LAB_001ad622;
      }
      else {
        if (iVar22 != 6) {
          __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2caa,"mir_size_t get_object_path_offset(c2m_ctx_t)");
        }
        raw_type_size(c2m_ctx,*(type **)(*(long *)(lVar7 + 0x30) + 8));
      }
      lVar31 = lVar31 + 0x18;
      pVVar21 = c2m_ctx->init_object_path;
    } while (pVVar21 != (VARR_init_object_t *)0x0);
  }
  get_object_path_offset_cold_2();
  return;
}

Assistant:

static void push_val (VARR (char) * repr, mir_long val) {
  mir_long bound;

  for (bound = 10; val >= bound;) bound *= 10;
  while (bound != 1) {
    bound /= 10;
    VARR_PUSH (char, repr, '0' + val / bound);
    val %= bound;
  }
}